

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_cipher_context_t * ptls_cipher_new(ptls_cipher_algorithm_t *algo,int is_enc,void *key)

{
  int iVar1;
  ptls_cipher_context_t *ppVar2;
  void *in_RDX;
  int in_ESI;
  st_ptls_cipher_algorithm_t *in_RDI;
  ptls_cipher_context_t *ctx;
  st_ptls_cipher_algorithm_t *local_48;
  _func_void_st_ptls_cipher_context_t_ptr *local_40;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr *local_38;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *local_30;
  ptls_cipher_context_t *local_28;
  void *local_20;
  int local_14;
  st_ptls_cipher_algorithm_t *local_10;
  ptls_cipher_context_t *local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  ppVar2 = (ptls_cipher_context_t *)malloc(in_RDI->context_size);
  if (ppVar2 == (ptls_cipher_context_t *)0x0) {
    local_8 = (ptls_cipher_context_t *)0x0;
  }
  else {
    local_28 = ppVar2;
    memset(&local_48,0,0x20);
    local_48 = local_10;
    ppVar2->algo = local_10;
    ppVar2->do_dispose = local_40;
    ppVar2->do_init = local_38;
    ppVar2->do_transform = local_30;
    iVar1 = (*local_10->setup_crypto)(local_28,local_14,local_20);
    if (iVar1 != 0) {
      free(local_28);
      local_28 = (ptls_cipher_context_t *)0x0;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

ptls_cipher_context_t *ptls_cipher_new(ptls_cipher_algorithm_t *algo, int is_enc, const void *key)
{
    ptls_cipher_context_t *ctx;

    if ((ctx = (ptls_cipher_context_t *)malloc(algo->context_size)) == NULL)
        return NULL;
    *ctx = (ptls_cipher_context_t){algo};
    if (algo->setup_crypto(ctx, is_enc, key) != 0) {
        free(ctx);
        ctx = NULL;
    }
    return ctx;
}